

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

Promise<siginfo_t> __thiscall kj::UnixEventPort::onSignal(UnixEventPort *this,int signum)

{
  bool bVar1;
  undefined4 in_register_00000034;
  byte local_6d;
  Fault local_60;
  Fault f;
  int *local_50;
  DebugComparison<int_&,_int> local_48;
  bool local_1d;
  int local_1c;
  bool _kjCondition;
  UnixEventPort *pUStack_18;
  int signum_local;
  UnixEventPort *this_local;
  
  pUStack_18 = (UnixEventPort *)CONCAT44(in_register_00000034,signum);
  this_local = this;
  local_50 = (int *)kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1c);
  f.exception._4_4_ = 0x11;
  kj::_::DebugExpression<int&>::operator!=
            (&local_48,(DebugExpression<int&> *)&local_50,(int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_48);
  local_6d = 1;
  if (!bVar1) {
    local_6d = kj::(anonymous_namespace)::capturedChildExit ^ 0xff;
  }
  local_1d = (bool)(local_6d & 1);
  if (local_1d != false) {
    newAdaptedPromise<siginfo_t,kj::UnixEventPort::SignalPromiseAdapter,kj::UnixEventPort&,int&>
              ((kj *)this,(UnixEventPort *)CONCAT44(in_register_00000034,signum),&local_1c);
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[87]>
            (&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
             ,0x165,FAILED,"signum != SIGCHLD || !capturedChildExit",
             "_kjCondition,\"can\'t call onSigal(SIGCHLD) when kj::UnixEventPort::captureChildExit() has been called\""
             ,&local_1d,
             (char (*) [87])
             "can\'t call onSigal(SIGCHLD) when kj::UnixEventPort::captureChildExit() has been called"
            );
  kj::_::Debug::Fault::fatal(&local_60);
}

Assistant:

Promise<siginfo_t> UnixEventPort::onSignal(int signum) {
  KJ_REQUIRE(signum != SIGCHLD || !capturedChildExit,
      "can't call onSigal(SIGCHLD) when kj::UnixEventPort::captureChildExit() has been called");
  return newAdaptedPromise<siginfo_t, SignalPromiseAdapter>(*this, signum);
}